

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::getViewportBoundingBoxArea
          (anon_unknown_1 *this,ProjectedBBox *bbox,IVec2 *viewportSize,float size)

{
  int iVar1;
  deInt32 dVar2;
  float *pfVar3;
  int *piVar4;
  float fVar5;
  IVec4 IVar6;
  undefined1 local_34 [8];
  Vec4 vertexBox;
  float size_local;
  IVec2 *viewportSize_local;
  ProjectedBBox *bbox_local;
  IVec4 *pixelBox;
  
  vertexBox.m_data[2] = size;
  unique0x10000232 = viewportSize;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_34);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this);
  fVar5 = tcu::Vector<float,_3>::x(&bbox->min);
  iVar1 = tcu::Vector<int,_2>::x(stack0xffffffffffffffe0);
  pfVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_34);
  *pfVar3 = (fVar5 * 0.5 + 0.5) * (float)iVar1;
  fVar5 = tcu::Vector<float,_3>::y(&bbox->min);
  iVar1 = tcu::Vector<int,_2>::y(stack0xffffffffffffffe0);
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_34);
  *pfVar3 = (fVar5 * 0.5 + 0.5) * (float)iVar1;
  fVar5 = tcu::Vector<float,_3>::x(&bbox->max);
  iVar1 = tcu::Vector<int,_2>::x(stack0xffffffffffffffe0);
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_34);
  *pfVar3 = (fVar5 * 0.5 + 0.5) * (float)iVar1;
  fVar5 = tcu::Vector<float,_3>::y(&bbox->max);
  iVar1 = tcu::Vector<int,_2>::y(stack0xffffffffffffffe0);
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_34);
  *pfVar3 = (fVar5 * 0.5 + 0.5) * (float)iVar1;
  pfVar3 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_34);
  dVar2 = ::deFloorFloatToInt32(*pfVar3 - vertexBox.m_data[2] / 2.0);
  piVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)this);
  *piVar4 = dVar2;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_34);
  dVar2 = ::deFloorFloatToInt32(*pfVar3 - vertexBox.m_data[2] / 2.0);
  piVar4 = tcu::Vector<int,_4>::y((Vector<int,_4> *)this);
  *piVar4 = dVar2;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_34);
  dVar2 = ::deCeilFloatToInt32(*pfVar3 + vertexBox.m_data[2] / 2.0);
  piVar4 = tcu::Vector<int,_4>::z((Vector<int,_4> *)this);
  *piVar4 = dVar2;
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_34);
  dVar2 = ::deCeilFloatToInt32(*pfVar3 + vertexBox.m_data[2] / 2.0);
  piVar4 = tcu::Vector<int,_4>::w((Vector<int,_4> *)this);
  *piVar4 = dVar2;
  IVar6.m_data[2] = dVar2;
  IVar6.m_data._0_8_ = this;
  IVar6.m_data[3] = 0;
  return (IVec4)IVar6.m_data;
}

Assistant:

static tcu::IVec4 getViewportBoundingBoxArea (const ProjectedBBox& bbox, const tcu::IVec2& viewportSize, float size = 0.0f)
{
	tcu::Vec4	vertexBox;
	tcu::IVec4	pixelBox;

	vertexBox.x() = (bbox.min.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.y() = (bbox.min.y() * 0.5f + 0.5f) * (float)viewportSize.y();
	vertexBox.z() = (bbox.max.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.w() = (bbox.max.y() * 0.5f + 0.5f) * (float)viewportSize.y();

	pixelBox.x() = deFloorFloatToInt32(vertexBox.x() - size/2.0f);
	pixelBox.y() = deFloorFloatToInt32(vertexBox.y() - size/2.0f);
	pixelBox.z() = deCeilFloatToInt32(vertexBox.z() + size/2.0f);
	pixelBox.w() = deCeilFloatToInt32(vertexBox.w() + size/2.0f);
	return pixelBox;
}